

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_job_queue_get_heap_layout
                    (ma_job_queue_config *pConfig,ma_job_queue_heap_layout *pHeapLayout)

{
  size_t local_40;
  size_t allocatorHeapSizeInBytes;
  ma_slot_allocator_config allocatorConfig;
  ma_result result;
  ma_job_queue_heap_layout *pHeapLayout_local;
  ma_job_queue_config *pConfig_local;
  
  _allocatorConfig = pHeapLayout;
  if (pHeapLayout != (ma_job_queue_heap_layout *)0x0) {
    memset(pHeapLayout,0,0x18);
    if (pConfig == (ma_job_queue_config *)0x0) {
      pConfig_local._4_4_ = MA_INVALID_ARGS;
    }
    else if (pConfig->capacity == 0) {
      pConfig_local._4_4_ = MA_INVALID_ARGS;
    }
    else {
      _allocatorConfig->sizeInBytes = 0;
      allocatorHeapSizeInBytes._0_4_ = ma_slot_allocator_config_init(pConfig->capacity);
      pConfig_local._4_4_ =
           ma_slot_allocator_get_heap_size
                     ((ma_slot_allocator_config *)&allocatorHeapSizeInBytes,&local_40);
      if (pConfig_local._4_4_ == MA_SUCCESS) {
        _allocatorConfig->allocatorOffset = _allocatorConfig->sizeInBytes;
        _allocatorConfig->sizeInBytes = local_40 + _allocatorConfig->sizeInBytes;
        _allocatorConfig->jobsOffset = _allocatorConfig->sizeInBytes;
        _allocatorConfig->sizeInBytes =
             (ulong)pConfig->capacity * 0x68 + _allocatorConfig->sizeInBytes;
        pConfig_local._4_4_ = MA_SUCCESS;
      }
    }
    return pConfig_local._4_4_;
  }
  __assert_fail("pHeapLayout != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                ,0x163b,
                "ma_result ma_job_queue_get_heap_layout(const ma_job_queue_config *, ma_job_queue_heap_layout *)"
               );
}

Assistant:

static ma_result ma_job_queue_get_heap_layout(const ma_job_queue_config* pConfig, ma_job_queue_heap_layout* pHeapLayout)
{
    ma_result result;

    MA_ASSERT(pHeapLayout != NULL);

    MA_ZERO_OBJECT(pHeapLayout);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->capacity == 0) {
        return MA_INVALID_ARGS;
    }

    pHeapLayout->sizeInBytes = 0;

    /* Allocator. */
    {
        ma_slot_allocator_config allocatorConfig;
        size_t allocatorHeapSizeInBytes;

        allocatorConfig = ma_slot_allocator_config_init(pConfig->capacity);
        result = ma_slot_allocator_get_heap_size(&allocatorConfig, &allocatorHeapSizeInBytes);
        if (result != MA_SUCCESS) {
            return result;
        }

        pHeapLayout->allocatorOffset = pHeapLayout->sizeInBytes;
        pHeapLayout->sizeInBytes    += allocatorHeapSizeInBytes;
    }

    /* Jobs. */
    pHeapLayout->jobsOffset   = pHeapLayout->sizeInBytes;
    pHeapLayout->sizeInBytes += ma_align_64(pConfig->capacity * sizeof(ma_job));

    return MA_SUCCESS;
}